

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.cc
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,Value *dst)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  ulong uVar3;
  long lVar4;
  pointer pSVar5;
  ulong uVar6;
  pointer pSVar7;
  pointer pSVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    bVar12 = false;
  }
  else {
    uVar2 = (*pvVar1->type_id)();
    bVar12 = uVar2 == 4;
  }
  if (bVar12) {
    return false;
  }
  if ((this->_blocked & 1U) != 0) {
    return false;
  }
  if (((!NAN(t)) ||
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
       (uVar2 = (*pvVar1->type_id)(), uVar2 == 0)))) ||
     ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
      (uVar2 = (*pvVar1->type_id)(), uVar2 == 1)))) {
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (this->_blocked == false) {
        pvVar1 = (this->_value).v_.vtable;
        if ((pvVar1 != (vtable_type *)0x0) && (uVar2 = (*pvVar1->type_id)(), uVar2 == 0)) {
          return false;
        }
        pvVar1 = (this->_value).v_.vtable;
        if ((pvVar1 != (vtable_type *)0x0) && (uVar2 = (*pvVar1->type_id)(), uVar2 == 1)) {
          return false;
        }
      }
    }
    else {
      if ((this->_ts)._dirty == true) {
        tinyusdz::value::TimeSamples::update(&this->_ts);
      }
      pSVar8 = (this->_ts)._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pSVar8 == (this->_ts)._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        return false;
      }
      if (NAN(t)) {
        if (pSVar8->blocked != false) {
          return false;
        }
      }
      else {
        if (tinterp != Held) {
          pvVar1 = (this->_value).v_.vtable;
          if (pvVar1 == (vtable_type *)0x0) {
            uVar2 = 2;
          }
          else {
            uVar2 = (*pvVar1->type_id)();
          }
          bVar12 = tinyusdz::value::IsLerpSupportedType(uVar2);
          if (bVar12) {
            pSVar8 = (this->_ts)._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar3 = (long)(this->_ts)._samples.
                          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8;
            pSVar7 = pSVar8;
            if (0 < (long)uVar3) {
              uVar6 = (uVar3 >> 3) * -0x3333333333333333;
              do {
                uVar9 = uVar6 >> 1;
                uVar10 = uVar9;
                if (pSVar7[uVar9].t <= t && t != pSVar7[uVar9].t) {
                  uVar10 = ~uVar9 + uVar6;
                  pSVar7 = pSVar7 + uVar9 + 1;
                }
                uVar6 = uVar10;
              } while (0 < (long)uVar10);
            }
            pSVar5 = pSVar7 + -1;
            if (pSVar7 == pSVar8) {
              pSVar5 = pSVar8;
            }
            lVar4 = ((long)uVar3 >> 3) * -0x3333333333333333 + -1;
            lVar11 = ((long)pSVar5 - (long)pSVar8 >> 3) * -0x3333333333333333;
            if (lVar4 <= lVar11) {
              lVar11 = lVar4;
            }
            if (lVar11 < 1) {
              lVar11 = 0;
            }
            if (lVar11 + 1 < lVar4) {
              lVar4 = lVar11 + 1;
            }
            if (lVar4 < 1) {
              lVar4 = 0;
            }
            dVar14 = *(double *)((long)(&pSVar8[lVar11].value + -1) + 0x10);
            dVar13 = *(double *)((long)(&pSVar8[lVar4].value + -1) + 0x10) - dVar14;
            dVar14 = (double)(~-(ulong)(ABS(dVar13) < 2.220446049250313e-16) &
                             (ulong)((t - dVar14) / dVar13));
            if (1.0 <= dVar14) {
              dVar14 = 1.0;
            }
            if (dVar14 <= 0.0) {
              dVar14 = 0.0;
            }
            bVar12 = tinyusdz::value::Lerp(&pSVar8[lVar11].value,&pSVar8[lVar4].value,dVar14,dst);
            return bVar12;
          }
        }
        pSVar7 = (this->_ts)._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = (long)(this->_ts)._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7;
        pSVar5 = pSVar7;
        if (0 < (long)uVar3) {
          uVar3 = (uVar3 >> 3) * -0x3333333333333333;
          do {
            uVar10 = uVar3 >> 1;
            uVar6 = uVar10;
            if (pSVar5[uVar10].t <= t) {
              uVar6 = ~uVar10 + uVar3;
              pSVar5 = pSVar5 + uVar10 + 1;
            }
            uVar3 = uVar6;
          } while (0 < (long)uVar6);
        }
        pSVar8 = pSVar5 + -1;
        if (pSVar5 == pSVar7) {
          pSVar8 = pSVar7;
        }
      }
      this = (PrimVar *)&pSVar8->value;
    }
  }
  linb::any::operator=(&dst->v_,(any *)this);
  return true;
}

Assistant:

bool PrimVar::get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, value::Value *dst) const {

  if (is_blocked()) {
    return false;
  }

  if (value::TimeCode(t).is_default()) {
    if (has_default()) {
      (*dst) = _value;
      return true;
    }
  }

  if (has_timesamples()) {
    const std::vector<value::TimeSamples::Sample> &samples = _ts.get_samples();

    if (samples.empty()) {
      // ???
      return false;
    }

    if (value::TimeCode(t).is_default())  {
      // FIXME: Use the first item for now.
      if (samples[0].blocked) {
        return false;
      }

      (*dst) = samples[0].value;
      return true;
    } else {

      if (tinterp == value::TimeSampleInterpolationType::Held || !value::IsLerpSupportedType(_value.type_id())) {

        auto it = std::upper_bound(
          samples.begin(), samples.end(), t,
          [](double tval, const value::TimeSamples::Sample &a) { return tval < a.t; });

        const auto it_minus_1 = (it == samples.begin()) ? samples.begin() : (it - 1);

        (*dst) = it_minus_1->value;
        return true;

      } else { // Lerp 

        // TODO: Unify code in prim-types.hh
        auto it = std::lower_bound(
            samples.begin(), samples.end(), t,
            [](const value::TimeSamples::Sample &a, double tval) { return a.t < tval; });

        const auto it_minus_1 = (it == samples.begin()) ? samples.begin() : (it - 1);

        size_t idx0 = size_t(std::max(
            int64_t(0),
            std::min(int64_t(samples.size() - 1),
                     int64_t(std::distance(samples.begin(), it_minus_1)))));
        size_t idx1 =
            size_t(std::max(int64_t(0), std::min(int64_t(samples.size() - 1),
                                                 int64_t(idx0) + 1)));

        double tl = samples[idx0].t;
        double tu = samples[idx1].t;

        double dt = (t - tl);
        if (std::fabs(tu - tl) < std::numeric_limits<double>::epsilon()) {
          // slope is zero.
          dt = 0.0;
        } else {
          dt /= (tu - tl);
        }

        // Just in case.
        dt = std::max(0.0, std::min(1.0, dt));

        const value::Value &p0 = samples[idx0].value;
        const value::Value &p1 = samples[idx1].value;

        bool ret = value::Lerp(p0, p1, dt, dst);
        return ret;
      }
    }
  }

  if (has_default()) {
    (*dst) = _value;
    return true;
  }

  return false;
}